

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O3

void __thiscall
gl4cts::CopyImage::FunctionalTest::prepareTestCases
          (FunctionalTest *this,GLenum dst_internal_format,GLenum dst_target,
          GLenum src_internal_format,GLenum src_target)

{
  pointer *pptVar1;
  GLuint GVar2;
  GLuint GVar3;
  bool bVar4;
  bool bVar5;
  GLenum GVar6;
  GLenum GVar7;
  GLenum GVar8;
  GLenum GVar9;
  bool bVar10;
  long lVar11;
  testCase *ptVar12;
  iterator iVar13;
  GLuint dst_level;
  GLuint GVar14;
  bool bVar15;
  byte bVar16;
  GLuint local_b4;
  GLuint local_b0;
  GLuint local_ac;
  testCase local_80;
  
  bVar16 = 0;
  local_ac = 3;
  if ((int)dst_target < 0x9100) {
    if ((dst_target == 0x84f5) || (dst_target == 0x8d41)) {
LAB_00870016:
      local_ac = 1;
    }
  }
  else if ((dst_target == 0x9102) || (dst_target == 0x9100)) goto LAB_00870016;
  local_b0 = 3;
  if ((int)src_target < 0x9100) {
    if ((src_target != 0x84f5) && (src_target != 0x8d41)) goto LAB_00870061;
  }
  else if ((src_target != 0x9102) && (src_target != 0x9100)) goto LAB_00870061;
  local_b0 = 1;
LAB_00870061:
  GVar6 = Utils::getFormat(dst_internal_format);
  GVar7 = Utils::getType(dst_internal_format);
  GVar8 = Utils::getFormat(src_internal_format);
  GVar9 = Utils::getType(src_internal_format);
  local_b4 = 0;
  do {
    GVar14 = 0;
    do {
      lVar11 = 0;
      bVar5 = true;
      do {
        bVar10 = bVar5;
        GVar2 = prepareTestCases::image_dimmensions[lVar11];
        lVar11 = 0;
        bVar5 = true;
        do {
          bVar4 = bVar5;
          GVar3 = prepareTestCases::image_dimmensions[lVar11];
          lVar11 = 0;
          bVar5 = true;
          do {
            bVar15 = bVar5;
            local_80.m_width = prepareTestCases::region_dimmensions[lVar11];
            local_80.m_dst.m_target = dst_target;
            local_80.m_dst.m_width = GVar3;
            local_80.m_dst.m_height = GVar3;
            local_80.m_dst.m_level = GVar14;
            local_80.m_dst.m_internal_format = dst_internal_format;
            local_80.m_dst.m_format = GVar6;
            local_80.m_dst.m_type = GVar7;
            local_80.m_src.m_target = src_target;
            local_80.m_src.m_width = GVar2;
            local_80.m_src.m_height = GVar2;
            local_80.m_src.m_level = local_b4;
            local_80.m_src.m_internal_format = src_internal_format;
            local_80.m_src.m_format = GVar8;
            local_80.m_src.m_type = GVar9;
            local_80.m_height = local_80.m_width;
            local_80.m_dst_y = GVar3 - local_80.m_width;
            local_80.m_dst_x = GVar3 - local_80.m_width;
            local_80.m_src_x = 0;
            local_80.m_src_y = 0;
            iVar13._M_current =
                 (this->m_test_cases).
                 super__Vector_base<gl4cts::CopyImage::FunctionalTest::testCase,_std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar13._M_current ==
                (this->m_test_cases).
                super__Vector_base<gl4cts::CopyImage::FunctionalTest::testCase,_std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<gl4cts::CopyImage::FunctionalTest::testCase,std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>>
              ::_M_realloc_insert<gl4cts::CopyImage::FunctionalTest::testCase_const&>
                        ((vector<gl4cts::CopyImage::FunctionalTest::testCase,std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>>
                          *)&this->m_test_cases,iVar13,&local_80);
            }
            else {
              ptVar12 = &local_80;
              for (lVar11 = 0x14; lVar11 != 0; lVar11 = lVar11 + -1) {
                ((iVar13._M_current)->m_dst).m_target = (ptVar12->m_dst).m_target;
                ptVar12 = (testCase *)((long)ptVar12 + (ulong)bVar16 * -8 + 4);
                iVar13._M_current = iVar13._M_current + (ulong)bVar16 * -8 + 4;
              }
              pptVar1 = &(this->m_test_cases).
                         super__Vector_base<gl4cts::CopyImage::FunctionalTest::testCase,_std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *pptVar1 = *pptVar1 + 1;
            }
            if (GVar3 == GVar2 && !bVar4) {
              local_80.m_dst_x = 0;
              local_80.m_dst_y = 0;
              local_80.m_src_x = 0;
              local_80.m_src_y = 0;
              local_80.m_width = GVar2;
              local_80.m_height = GVar2;
              iVar13._M_current =
                   (this->m_test_cases).
                   super__Vector_base<gl4cts::CopyImage::FunctionalTest::testCase,_std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (iVar13._M_current ==
                  (this->m_test_cases).
                  super__Vector_base<gl4cts::CopyImage::FunctionalTest::testCase,_std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<gl4cts::CopyImage::FunctionalTest::testCase,std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>>
                ::_M_realloc_insert<gl4cts::CopyImage::FunctionalTest::testCase_const&>
                          ((vector<gl4cts::CopyImage::FunctionalTest::testCase,std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>>
                            *)&this->m_test_cases,iVar13,&local_80);
              }
              else {
                ptVar12 = &local_80;
                for (lVar11 = 0x14; lVar11 != 0; lVar11 = lVar11 + -1) {
                  ((iVar13._M_current)->m_dst).m_target = (ptVar12->m_dst).m_target;
                  ptVar12 = (testCase *)((long)ptVar12 + (ulong)bVar16 * -8 + 4);
                  iVar13._M_current = iVar13._M_current + (ulong)bVar16 * -8 + 4;
                }
                pptVar1 = &(this->m_test_cases).
                           super__Vector_base<gl4cts::CopyImage::FunctionalTest::testCase,_std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *pptVar1 = *pptVar1 + 1;
              }
            }
            lVar11 = 1;
            bVar5 = false;
          } while (bVar15);
          bVar5 = false;
        } while (bVar4);
        bVar5 = false;
      } while (bVar10);
      GVar14 = GVar14 + 1;
    } while (GVar14 != local_ac);
    local_b4 = local_b4 + 1;
  } while (local_b4 != local_b0);
  return;
}

Assistant:

void FunctionalTest::prepareTestCases(GLenum dst_internal_format, GLenum dst_target, GLenum src_internal_format,
									  GLenum src_target)
{
	static const GLuint image_dimmensions[] = {
		7,
#if COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_IMG_DIM
		8,
		9,
		10,
		11,
		12,
		13,
		14,
#endif /* COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_IMG_DIM */
		15
	};

	static const GLuint region_dimmensions[] = {
		1,
#if COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_DIM
		2,
		3,
		4,
		5,
		6,
#endif /* COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_DIM */
		7
	};

	static const GLuint n_image_dimmensions  = sizeof(image_dimmensions) / sizeof(image_dimmensions[0]);
	static const GLuint n_region_dimmensions = sizeof(region_dimmensions) / sizeof(region_dimmensions[0]);

	const bool   is_dst_multi_level = Utils::isTargetMultilevel(dst_target);
	const bool   is_src_multi_level = Utils::isTargetMultilevel(src_target);
	const GLenum dst_format			= Utils::getFormat(dst_internal_format);
	const GLuint dst_n_levels		= (true == is_dst_multi_level) ? FUNCTIONAL_TEST_N_LEVELS : 1;
	const GLenum dst_type			= Utils::getType(dst_internal_format);
	const GLenum src_format			= Utils::getFormat(src_internal_format);
	const GLuint src_n_levels		= (true == is_src_multi_level) ? FUNCTIONAL_TEST_N_LEVELS : 1;
	const GLenum src_type			= Utils::getType(src_internal_format);

	for (GLuint src_level = 0; src_level < src_n_levels; ++src_level)
	{
		for (GLuint dst_level = 0; dst_level < dst_n_levels; ++dst_level)
		{
			for (GLuint src_img_dim_id = 0; src_img_dim_id < n_image_dimmensions; ++src_img_dim_id)
			{
				const GLuint src_image_dimmension = image_dimmensions[src_img_dim_id];

				for (GLuint dst_img_dim_id = 0; dst_img_dim_id < n_image_dimmensions; ++dst_img_dim_id)
				{
					const GLuint dst_image_dimmension = image_dimmensions[dst_img_dim_id];

					for (GLuint reg_dim_id = 0; reg_dim_id < n_region_dimmensions; ++reg_dim_id)
					{
						const GLuint region_dimmension = region_dimmensions[reg_dim_id];
						GLuint		 dst_coord[3]	  = { 0, 0, 0 };
						const GLuint dst_dim_diff	  = dst_image_dimmension - region_dimmension;
						GLuint		 n_dst_coords	  = 1;
#if COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS
						GLuint n_src_coords = 1;
#endif /* COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS */
						GLuint		 src_coord[3] = { 0, 0, 0 };
						const GLuint src_dim_diff = src_image_dimmension - region_dimmension;

						/* Calculate coords */
						if (1 == dst_dim_diff)
						{
							dst_coord[1] = 1;
							n_dst_coords = 2;
						}
						else if (1 < dst_dim_diff)
						{
							dst_coord[1] = dst_dim_diff / 2;
							dst_coord[2] = dst_dim_diff;
							n_dst_coords = 3;
						}

						if (1 == src_dim_diff)
						{
							src_coord[1] = 1;
#if COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS
							n_src_coords = 2;
#endif /* COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS */
						}
						else if (1 < src_dim_diff)
						{
							src_coord[1] = src_dim_diff / 2;
							src_coord[2] = src_dim_diff;
#if COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS
							n_src_coords = 3;
#endif /* COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS */
						}

						testCase test_case = {
							{									/* m_dst */
							  dst_target, dst_image_dimmension, /* width */
							  dst_image_dimmension,				/* height */
							  dst_level, dst_internal_format, dst_format, dst_type },
							0,									/* dst_x */
							0,									/* dst_y */
							{									/* m_src */
							  src_target, src_image_dimmension, /* width */
							  src_image_dimmension,				/* height */
							  src_level, src_internal_format, src_format, src_type },
							0,				   /* src_x */
							0,				   /* src_y */
							region_dimmension, /* width */
							region_dimmension, /* height */
						};

#if COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS
						for (GLuint src_x = 0; src_x < n_src_coords; ++src_x)
						{
							for (GLuint src_y = 0; src_y < n_src_coords; ++src_y)
							{
								for (GLuint dst_x = 0; dst_x < n_dst_coords; ++dst_x)
								{
									for (GLuint dst_y = 0; dst_y < n_dst_coords; ++dst_y)
									{
										test_case.m_dst_x = dst_coord[dst_x];
										test_case.m_dst_y = dst_coord[dst_y];
										test_case.m_src_x = src_coord[src_x];
										test_case.m_src_y = src_coord[src_y];

										m_test_cases.push_back(test_case);
									}
								}
							}
						}
#else  /* COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS */
						test_case.m_dst_x = dst_coord[n_dst_coords - 1];
						test_case.m_dst_y = dst_coord[n_dst_coords - 1];
						test_case.m_src_x = src_coord[0];
						test_case.m_src_y = src_coord[0];

						m_test_cases.push_back(test_case);
#endif /* COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS */

						/* Whole image, for non 7x7 */
						if ((dst_image_dimmension == src_image_dimmension) &&
							(image_dimmensions[0] != dst_image_dimmension))
						{
							test_case.m_dst_x  = 0;
							test_case.m_dst_y  = 0;
							test_case.m_src_x  = 0;
							test_case.m_src_y  = 0;
							test_case.m_width  = dst_image_dimmension;
							test_case.m_height = dst_image_dimmension;

							m_test_cases.push_back(test_case);
						}
					}
				}
			}
		}
	}
}